

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

event_process_result __thiscall
afsm::
state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
process_event<afsm::test::events::error>
          (state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,error *event)

{
  __atomic_flag_data_type _Var1;
  event_process_result eVar2;
  __int_type _Var3;
  event_process_result res;
  error *event_local;
  state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  memory_order __b;
  
  _Var3 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->queue_size_);
  if (_Var3 == 0) {
    LOCK();
    _Var1 = (this->is_top_).super___atomic_flag_base._M_i;
    (this->is_top_).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      eVar2 = process_event_dispatch<afsm::test::events::error>(this,event);
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      LOCK();
      (this->is_top_).super___atomic_flag_base._M_i = false;
      UNLOCK();
      process_event_queue(this);
      return eVar2;
    }
  }
  enqueue_event<afsm::test::events::error>(this,event);
  return defer;
}

Assistant:

actions::event_process_result
    process_event( Event&& event )
    {
        if (!queue_size_ && !is_top_.test_and_set()) {
            auto res = process_event_dispatch(::std::forward<Event>(event));
            is_top_.clear();
            // Process enqueued events
            process_event_queue();
            return res;
        } else {
            // Enqueue event
            enqueue_event(::std::forward<Event>(event));
            return actions::event_process_result::defer;
        }
    }